

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_fasta.cpp
# Opt level: O3

bool __thiscall BamTools::Fasta::FastaPrivate::GetNextHeader(FastaPrivate *this,string *header)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  ostream *poVar4;
  long lVar5;
  stringstream headerBuffer;
  char buffer [1024];
  undefined1 *local_5c0 [2];
  undefined1 local_5b0 [16];
  stringstream local_5a0 [16];
  ostream local_590 [112];
  ios_base local_520 [264];
  stringstream local_418 [1024];
  
  if ((this->IsOpen == true) && (iVar1 = feof((FILE *)this->Stream), iVar1 == 0)) {
    pcVar2 = fgets((char *)local_418,0x400,(FILE *)this->Stream);
    if (pcVar2 == (char *)0x0) {
      poVar4 = (ostream *)&std::cerr;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"FASTA error : could not read from file",0x26);
      lVar5 = std::cerr;
    }
    else {
      if (local_418[0] == (stringstream)0x3e) {
        std::__cxx11::stringstream::stringstream(local_5a0);
        sVar3 = strlen((char *)local_418);
        std::__ostream_insert<char,std::char_traits<char>>(local_590,(char *)local_418,sVar3);
        std::__cxx11::stringbuf::str();
        std::__cxx11::string::operator=((string *)header,(string *)local_5c0);
        if (local_5c0[0] != local_5b0) {
          operator_delete(local_5c0[0]);
        }
        std::__cxx11::stringstream::~stringstream(local_5a0);
        std::ios_base::~ios_base(local_520);
        return true;
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"FASTA error : expected header (\'>\'), instead : ",0x2f);
      local_5a0[0] = local_418[0];
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,(char *)local_5a0,1);
      lVar5 = *(long *)poVar4;
    }
    std::ios::widen((char)*(undefined8 *)(lVar5 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
  }
  return false;
}

Assistant:

bool Fasta::FastaPrivate::GetNextHeader(std::string& header)
{

    // validate input stream
    if (!IsOpen || feof(Stream)) return false;

    // read in header line
    char buffer[1024];
    if (fgets(buffer, 1024, Stream) == 0) {
        std::cerr << "FASTA error : could not read from file" << std::endl;
        return false;
    }

    // make sure it's a FASTA header
    if (buffer[0] != '>') {
        std::cerr << "FASTA error : expected header ('>'), instead : " << buffer[0] << std::endl;
        return false;
    }

    // import buffer contents to header string
    std::stringstream headerBuffer;
    headerBuffer << buffer;
    header = headerBuffer.str();

    // return success
    return true;
}